

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::SortImports::toplevelImport
          (SortImports *this,Local *local,ImportElems *imports,Fodder *groupOpenFodder)

{
  bool bVar1;
  Local *pLVar2;
  pointer in_RCX;
  __normal_iterator<jsonnet::internal::SortImports::ImportElem_*,_std::vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>_>
  in_RDX;
  pointer in_RSI;
  ImportElems nextImports;
  Local *next;
  AST *bodyAfterGroup;
  Fodder nextOpenFodder;
  Fodder afterGroup;
  ImportElems newImports;
  Fodder beforeNextFodder;
  Fodder adjacentCommentFodder;
  vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
  *in_stack_fffffffffffffe08;
  pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  *in_stack_fffffffffffffe10;
  pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  *in_stack_fffffffffffffe18;
  Local *in_stack_fffffffffffffe20;
  SortImports *in_stack_fffffffffffffe28;
  Local *in_stack_fffffffffffffe30;
  Fodder *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffe58;
  __normal_iterator<jsonnet::internal::SortImports::ImportElem_*,_std::vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>_>
  __last;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffe60;
  const_iterator in_stack_fffffffffffffe68;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffea8;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffeb0;
  SortImports *in_stack_fffffffffffffeb8;
  pointer in_stack_ffffffffffffffc8;
  AST *in_stack_ffffffffffffffd0;
  ImportElem *local_00;
  AST *local_8;
  
  bVar1 = isGoodLocal(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  if (!bVar1) {
    __assert_fail("isGoodLocal(local)",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                  ,0x8c6,
                  "AST *jsonnet::internal::SortImports::toplevelImport(Local *, ImportElems &, const Fodder &)"
                 );
  }
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)0x2bf798);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)0x2bf7a5);
  internal::open_fodder((AST *)0x2bf7b9);
  splitFodder(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  std::
  tie<std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>>
            (&in_stack_fffffffffffffe18->first,&in_stack_fffffffffffffe10->first);
  std::
  tuple<std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
  ::operator=((tuple<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_&,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_&>
               *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  std::
  pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  ::~pair(in_stack_fffffffffffffe10);
  ensureCleanNewline(in_stack_fffffffffffffe60);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  extractImportElems((SortImports *)in_RCX,(Binds *)in_stack_ffffffffffffffd0,
                     (Fodder *)in_stack_ffffffffffffffc8);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           *)in_stack_fffffffffffffe20);
  local_00 = in_RDX._M_current;
  std::
  vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
  ::end(in_stack_fffffffffffffe08);
  __gnu_cxx::
  __normal_iterator<jsonnet::internal::SortImports::ImportElem_const*,std::vector<jsonnet::internal::SortImports::ImportElem,std::allocator<jsonnet::internal::SortImports::ImportElem>>>
  ::__normal_iterator<jsonnet::internal::SortImports::ImportElem*>
            ((__normal_iterator<const_jsonnet::internal::SortImports::ImportElem_*,_std::vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>_>
              *)in_stack_fffffffffffffe10,
             (__normal_iterator<jsonnet::internal::SortImports::ImportElem_*,_std::vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>_>
              *)in_stack_fffffffffffffe08);
  __last._M_current = (ImportElem *)&stack0xffffffffffffff40;
  std::
  vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
  ::begin(in_stack_fffffffffffffe08);
  std::
  vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
  ::end(in_stack_fffffffffffffe08);
  std::
  vector<jsonnet::internal::SortImports::ImportElem,std::allocator<jsonnet::internal::SortImports::ImportElem>>
  ::
  insert<__gnu_cxx::__normal_iterator<jsonnet::internal::SortImports::ImportElem*,std::vector<jsonnet::internal::SortImports::ImportElem,std::allocator<jsonnet::internal::SortImports::ImportElem>>>,void>
            ((vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
              *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
             in_stack_fffffffffffffe68,in_RDX,__last);
  bVar1 = groupEndsAfter((SortImports *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  if (bVar1) {
    sortGroup((SortImports *)in_stack_fffffffffffffe20,(ImportElems *)in_stack_fffffffffffffe18);
    std::
    vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
    ::back((vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
            *)in_stack_fffffffffffffe10);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_RDX._M_current,
             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)__last._M_current);
    ensureCleanNewline((Fodder *)in_RDX._M_current);
    concat_fodder(in_stack_fffffffffffffe38,(Fodder *)in_stack_fffffffffffffe30);
    pLVar2 = goodLocalOrNull((SortImports *)in_stack_fffffffffffffe38,
                             &in_stack_fffffffffffffe30->super_AST);
    if (pLVar2 == (Local *)0x0) {
      internal::open_fodder((AST *)0x2bfb23);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    }
    else {
      std::
      vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
      ::vector((vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
                *)0x2bfa07);
      toplevelImport((SortImports *)in_RSI,(Local *)local_00,(ImportElems *)in_RCX,
                     (Fodder *)in_stack_ffffffffffffffd0);
      std::
      vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
      ::~vector((vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
                 *)in_stack_fffffffffffffe20);
    }
    local_8 = buildGroupAST((SortImports *)local_00,(ImportElems *)in_RCX,in_stack_ffffffffffffffd0,
                            (Fodder *)in_stack_ffffffffffffffc8);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_fffffffffffffe20);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_fffffffffffffe20);
  }
  else {
    bVar1 = std::
            vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ::empty((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)in_stack_fffffffffffffe20);
    if (!bVar1) {
      __assert_fail("beforeNextFodder.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                    ,0x8e6,
                    "AST *jsonnet::internal::SortImports::toplevelImport(Local *, ImportElems &, const Fodder &)"
                   );
    }
    in_stack_fffffffffffffe20 =
         (Local *)in_RSI[1].commaFodder.
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (in_stack_fffffffffffffe20 != (Local *)0x0) {
      __dynamic_cast(in_stack_fffffffffffffe20,&AST::typeinfo,&Local::typeinfo,0);
    }
    local_8 = toplevelImport((SortImports *)in_RSI,(Local *)local_00,(ImportElems *)in_RCX,
                             (Fodder *)in_stack_ffffffffffffffd0);
  }
  std::
  vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
  ::~vector((vector<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
             *)in_stack_fffffffffffffe20);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           *)in_stack_fffffffffffffe20);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           *)in_stack_fffffffffffffe20);
  return local_8;
}

Assistant:

AST *toplevelImport(Local *local, ImportElems &imports, const Fodder &groupOpenFodder)
    {
        assert(isGoodLocal(local));

        Fodder adjacentCommentFodder, beforeNextFodder;
        std::tie(adjacentCommentFodder, beforeNextFodder) = splitFodder(open_fodder(local->body));

        ensureCleanNewline(adjacentCommentFodder);

        ImportElems newImports = extractImportElems(local->binds, adjacentCommentFodder);
        imports.insert(imports.end(), newImports.begin(), newImports.end());

        if (groupEndsAfter(local)) {
            sortGroup(imports);

            Fodder afterGroup = imports.back().adjacentFodder;
            ensureCleanNewline(beforeNextFodder);
            auto nextOpenFodder = concat_fodder(afterGroup, beforeNextFodder);

            // Process the code after the current group:
            AST *bodyAfterGroup;
            Local *next = goodLocalOrNull(local->body);
            if (next) {
                // Another group of imports
                ImportElems nextImports;
                bodyAfterGroup = toplevelImport(next, nextImports, nextOpenFodder);
            } else {
                // Something else
                bodyAfterGroup = local->body;
                open_fodder(bodyAfterGroup) = nextOpenFodder;
            }

            return buildGroupAST(imports, bodyAfterGroup, groupOpenFodder);
        } else {
            assert(beforeNextFodder.empty());
            return toplevelImport(dynamic_cast<Local *>(local->body), imports, groupOpenFodder);
        }
    }